

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImStb::stb_textedit_paste
              (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  bool bVar1;
  undefined7 extraout_var;
  ImWchar *pIVar3;
  int iVar2;
  
  stb_textedit_clamp(str,state);
  stb_textedit_delete_selection(str,state);
  bVar1 = STB_TEXTEDIT_INSERTCHARS(str,state->cursor,ctext,len);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    pIVar3 = stb_text_createundo(&state->undostate,state->cursor,0,len);
    iVar2 = (int)pIVar3;
    state->cursor = state->cursor + len;
    state->has_preferred_x = '\0';
  }
  return iVar2;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   return stb_textedit_paste_internal(str, state, (STB_TEXTEDIT_CHARTYPE *) ctext, len);
}